

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int xferCompatibleIndex(Index *pDest,Index *pSrc)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = pDest->nKeyCol;
  uVar3 = 0;
  if ((uVar1 == pSrc->nKeyCol) && (pDest->onError == pSrc->onError)) {
    lVar4 = 0;
    uVar5 = 0;
    while (uVar1 != uVar5) {
      if (pSrc->aiColumn[uVar5] != pDest->aiColumn[uVar5]) {
        return 0;
      }
      if ((pSrc->aiColumn[uVar5] == -2) &&
         (iVar2 = sqlite3ExprCompare(*(Expr **)((long)&pSrc->aColExpr->a->pExpr + lVar4),
                                     *(Expr **)((long)&pDest->aColExpr->a->pExpr + lVar4),-1),
         iVar2 != 0)) {
        return 0;
      }
      if (pSrc->aSortOrder[uVar5] != pDest->aSortOrder[uVar5]) {
        return 0;
      }
      iVar2 = sqlite3_stricmp(pSrc->azColl[uVar5],pDest->azColl[uVar5]);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
      if (iVar2 != 0) {
        return 0;
      }
    }
    iVar2 = sqlite3ExprCompare(pSrc->pPartIdxWhere,pDest->pPartIdxWhere,-1);
    uVar3 = (uint)(iVar2 == 0);
  }
  return uVar3;
}

Assistant:

static int xferCompatibleIndex(Index *pDest, Index *pSrc){
  int i;
  assert( pDest && pSrc );
  assert( pDest->pTable!=pSrc->pTable );
  if( pDest->nKeyCol!=pSrc->nKeyCol ){
    return 0;   /* Different number of columns */
  }
  if( pDest->onError!=pSrc->onError ){
    return 0;   /* Different conflict resolution strategies */
  }
  for(i=0; i<pSrc->nKeyCol; i++){
    if( pSrc->aiColumn[i]!=pDest->aiColumn[i] ){
      return 0;   /* Different columns indexed */
    }
    if( pSrc->aiColumn[i]==XN_EXPR ){
      assert( pSrc->aColExpr!=0 && pDest->aColExpr!=0 );
      if( sqlite3ExprCompare(pSrc->aColExpr->a[i].pExpr,
                             pDest->aColExpr->a[i].pExpr, -1)!=0 ){
        return 0;   /* Different expressions in the index */
      }
    }
    if( pSrc->aSortOrder[i]!=pDest->aSortOrder[i] ){
      return 0;   /* Different sort orders */
    }
    if( sqlite3_stricmp(pSrc->azColl[i],pDest->azColl[i])!=0 ){
      return 0;   /* Different collating sequences */
    }
  }
  if( sqlite3ExprCompare(pSrc->pPartIdxWhere, pDest->pPartIdxWhere, -1) ){
    return 0;     /* Different WHERE clauses */
  }

  /* If no test above fails then the indices must be compatible */
  return 1;
}